

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmdif.c
# Opt level: O3

int lmdif_cvkit(S_fp fcn,integer *m,integer *n,doublereal *x,doublereal *fvec,doublereal *ftol,
               doublereal *xtol,doublereal *gtol,integer *maxfev,doublereal *epsfcn,doublereal *diag
               ,integer *mode,doublereal *factor,integer *nprint,integer *info,integer *nfev,
               doublereal *fjac,integer *ldfjac,integer *ipvt,doublereal *qtf,doublereal *wa1,
               doublereal *wa2,doublereal *wa3,doublereal *wa4,void *up)

{
  int iVar1;
  long lVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  doublereal *pdVar6;
  doublereal *pdVar7;
  long lVar8;
  double dVar9;
  double *pdVar10;
  bool bVar11;
  ulong uVar12;
  doublereal dVar13;
  double dVar14;
  double dVar15;
  doublereal dVar16;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 uVar17;
  undefined8 uVar18;
  double dVar19;
  integer local_118;
  doublereal delta;
  double local_108;
  undefined8 uStack_100;
  ulong local_f8;
  doublereal par;
  S_fp local_e8;
  long local_e0;
  doublereal local_d8;
  undefined8 uStack_d0;
  doublereal local_c8;
  undefined8 uStack_c0;
  doublereal local_b0;
  long local_a8;
  double *local_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  doublereal local_70;
  long local_68;
  doublereal *local_60;
  doublereal local_58;
  double local_48;
  
  local_f8 = *ldfjac;
  local_e8 = fcn;
  local_a0 = ftol;
  dVar13 = dpmpar_cvkit(&c__1);
  *info = 0;
  local_118 = 0;
  *nfev = 0;
  lVar4 = *n;
  if (0 < lVar4) {
    lVar5 = *m;
    if (((((lVar5 < lVar4) || (*ldfjac < lVar5)) || (*local_a0 <= 0.0 && *local_a0 != 0.0)) ||
        ((*xtol <= 0.0 && *xtol != 0.0 || (*gtol <= 0.0 && *gtol != 0.0)))) ||
       ((*maxfev < 1 || (*factor <= 0.0)))) {
LAB_0011b79d:
      if (-1 < local_118) goto LAB_0011b7a9;
    }
    else {
      if (*mode == 2) {
        lVar2 = 0;
        do {
          if (diag[lVar2] <= 0.0) goto LAB_0011b79d;
          lVar2 = lVar2 + 1;
        } while (lVar4 != lVar2);
      }
      local_58 = dVar13;
      iVar1 = (*local_e8)(lVar4,x,lVar5,fvec,up);
      uVar12 = local_f8;
      if (iVar1 < 0) {
        *nfev = 1;
LAB_0011b759:
        local_118 = (integer)iVar1;
      }
      else {
        local_60 = fjac + ~local_f8;
        *nfev = 1;
        local_d8 = enorm_cvkit(m,fvec);
        par = 0.0;
        local_a8 = uVar12 * 8;
        local_68 = uVar12 * 8 + 8;
        local_e0 = 1;
        local_108 = 0.0;
        uStack_100 = 0;
        local_c8 = 0.0;
        uStack_d0 = extraout_XMM0_Qb;
        while( true ) {
          local_118 = 2;
          fdjac2_cvkit(local_e8,m,n,x,fvec,fjac,ldfjac,&local_118,epsfcn,wa4,up);
          *nfev = *nfev + *n;
          if (local_118 < 0) break;
          if ((0 < *nprint) && (local_118 = 0, (local_e0 + -1) % *nprint == 0)) {
            iVar1 = (*local_e8)((ulong)(uint)*n,x,(ulong)(uint)*m,fvec,up);
            if (iVar1 < 0) goto LAB_0011b759;
            if (local_118 < 0) break;
          }
          qrfac_cvkit(m,n,fjac,ldfjac,&c_true,ipvt,n,wa1,wa2,wa3);
          dVar13 = local_c8;
          if (local_e0 == 1) {
            lVar4 = *n;
            if (*mode == 2) {
LAB_0011adcb:
              if (0 < lVar4) {
                lVar5 = 0;
                do {
                  wa3[lVar5] = diag[lVar5] * x[lVar5];
                  lVar5 = lVar5 + 1;
                } while (lVar4 != lVar5);
              }
            }
            else if (0 < lVar4) {
              lVar5 = 0;
              do {
                uVar12 = -(ulong)(wa2[lVar5] == 0.0);
                diag[lVar5] = (doublereal)
                              (uVar12 & 0x3ff0000000000000 | ~uVar12 & (ulong)wa2[lVar5]);
                lVar5 = lVar5 + 1;
              } while (lVar4 != lVar5);
              goto LAB_0011adcb;
            }
            dVar13 = enorm_cvkit(n,wa3);
            delta = dVar13 * *factor;
            if ((delta == 0.0) && (!NAN(delta))) {
              delta = *factor;
            }
          }
          lVar4 = *m;
          if (0 < lVar4) {
            lVar5 = 0;
            do {
              wa4[lVar5] = fvec[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar4 != lVar5);
          }
          dVar15 = (double)*n;
          dVar9 = local_108;
          uVar18 = uStack_100;
          if ((long)dVar15 < 1) {
LAB_0011b06a:
            dVar19 = 0.0;
          }
          else {
            lVar5 = 0;
            pdVar7 = wa4;
            pdVar6 = fjac;
            dVar9 = 4.94065645841247e-324;
            do {
              dVar19 = local_60[(long)dVar9 + (long)dVar9 * local_f8];
              if ((dVar19 != 0.0) || (NAN(dVar19))) {
                if (lVar4 < (long)dVar9) {
                  local_108 = -0.0 / dVar19;
                  uVar18 = 0;
                }
                else {
                  dVar3 = 0.0;
                  lVar2 = lVar5;
                  pdVar10 = pdVar6;
                  do {
                    dVar3 = dVar3 + *pdVar10 * wa4[lVar2];
                    lVar2 = lVar2 + 1;
                    pdVar10 = pdVar10 + 1;
                  } while (lVar2 < lVar4);
                  local_108 = -dVar3 / dVar19;
                  uVar18 = 0x8000000000000000;
                  if ((long)dVar9 <= lVar4) {
                    lVar2 = 0;
                    do {
                      pdVar7[lVar2] = pdVar6[lVar2] * local_108 + pdVar7[lVar2];
                      lVar8 = lVar5 + lVar2;
                      lVar2 = lVar2 + 1;
                    } while (lVar8 + 1 < lVar4);
                  }
                }
              }
              local_60[(long)dVar9 + (long)dVar9 * local_f8] = wa1[(long)dVar9 + -1];
              qtf[(long)dVar9 + -1] = wa4[(long)dVar9 + -1];
              lVar5 = lVar5 + 1;
              pdVar6 = (doublereal *)((long)pdVar6 + local_68);
              pdVar7 = pdVar7 + 1;
              bVar11 = dVar9 != dVar15;
              dVar9 = (double)((long)dVar9 + 1);
            } while (bVar11);
            dVar19 = 0.0;
            dVar9 = local_108;
            local_108 = dVar15;
            if (local_d8 == 0.0 || (long)dVar15 < 1) goto LAB_0011b06a;
            lVar5 = 1;
            pdVar7 = fjac;
            lVar4 = 2;
            do {
              dVar3 = wa2[ipvt[lVar5 + -1] + -1];
              if ((dVar3 != 0.0) || (NAN(dVar3))) {
                dVar14 = 0.0;
                lVar2 = 0;
                do {
                  dVar14 = dVar14 + (qtf[lVar2] / local_d8) * pdVar7[lVar2];
                  lVar2 = lVar2 + 1;
                } while (lVar5 != lVar2);
                dVar14 = dVar14 / dVar3;
                uVar12 = -(ulong)(-dVar14 <= dVar14);
                dVar3 = (double)(~uVar12 & (ulong)-dVar14 | (ulong)dVar14 & uVar12);
                uVar12 = -(ulong)(dVar3 <= dVar19);
                dVar19 = (double)(uVar12 & (ulong)dVar19 | ~uVar12 & (ulong)dVar3);
              }
              lVar5 = lVar5 + 1;
              pdVar7 = (doublereal *)((long)pdVar7 + local_a8);
              bVar11 = lVar4 != (long)dVar15 + 1;
              lVar4 = lVar4 + 1;
            } while (bVar11);
          }
          if (dVar19 <= *gtol) {
            lVar4 = 4;
LAB_0011b79a:
            *info = lVar4;
            goto LAB_0011b79d;
          }
          if (*info != 0) goto LAB_0011b79d;
          if (*mode != 2 && 0 < (long)dVar15) {
            dVar3 = 0.0;
            do {
              uVar12 = -(ulong)(wa2[(long)dVar3] <= diag[(long)dVar3]);
              diag[(long)dVar3] =
                   (doublereal)
                   (~uVar12 & (ulong)wa2[(long)dVar3] | (ulong)diag[(long)dVar3] & uVar12);
              dVar3 = (double)((long)dVar3 + 1);
            } while (dVar15 != dVar3);
          }
          uStack_80 = 0;
          local_108 = dVar9;
          uStack_100 = uVar18;
          local_c8 = dVar13;
          local_88 = dVar19;
          do {
            lmpar_cvkit(n,fjac,ldfjac,ipvt,diag,qtf,&delta,&par,wa1,wa2,wa3,wa4);
            lVar4 = *n;
            if (0 < lVar4) {
              lVar5 = 0;
              do {
                dVar15 = wa1[lVar5];
                wa1[lVar5] = -dVar15;
                wa2[lVar5] = x[lVar5] - dVar15;
                wa3[lVar5] = diag[lVar5] * wa1[lVar5];
                lVar5 = lVar5 + 1;
              } while (lVar4 != lVar5);
            }
            local_98 = enorm_cvkit(n,wa3);
            if (local_e0 == 1) {
              delta = (doublereal)
                      (~-(ulong)(delta <= local_98) & (ulong)local_98 |
                      (ulong)delta & -(ulong)(delta <= local_98));
            }
            local_118 = 1;
            uStack_90 = extraout_XMM0_Qb_00;
            (*local_e8)((ulong)(uint)*n,wa2,(ulong)(uint)*m,wa4,up);
            *nfev = *nfev + 1;
            if (local_118 < 0) goto LAB_0011b7a6;
            local_b0 = enorm_cvkit(m,wa4);
            local_48 = local_b0 * 0.1;
            lVar4 = *n;
            if (0 < lVar4) {
              lVar2 = 1;
              pdVar7 = fjac;
              lVar5 = 2;
              do {
                wa3[lVar2 + -1] = 0.0;
                local_108 = wa1[ipvt[lVar2 + -1] + -1];
                uStack_100 = 0;
                lVar8 = 0;
                do {
                  wa3[lVar8] = pdVar7[lVar8] * local_108 + wa3[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar2 != lVar8);
                lVar2 = lVar2 + 1;
                pdVar7 = (doublereal *)((long)pdVar7 + local_a8);
                bVar11 = lVar5 != lVar4 + 1;
                lVar5 = lVar5 + 1;
              } while (bVar11);
            }
            dVar13 = enorm_cvkit(n,wa3);
            if (par < 0.0) {
              local_70 = dVar13;
              dVar15 = sqrt(par);
              dVar13 = local_70;
              uVar18 = extraout_XMM0_Qb_01;
            }
            else {
              dVar15 = SQRT(par);
              uVar18 = 0;
            }
            dVar9 = (double)(~-(ulong)(local_48 < local_d8) & 0xbff0000000000000 |
                            (ulong)(1.0 - (local_b0 / local_d8) * (local_b0 / local_d8)) &
                            -(ulong)(local_48 < local_d8));
            dVar3 = (dVar15 * local_98) / local_d8;
            dVar3 = dVar3 * dVar3;
            dVar14 = (dVar13 / local_d8) * (dVar13 / local_d8);
            dVar19 = dVar3 + dVar3 + dVar14;
            dVar15 = (double)(-(ulong)(dVar19 != 0.0) & (ulong)(dVar9 / dVar19));
            if (dVar15 <= 0.25) {
              dVar14 = dVar14 + dVar3;
              dVar3 = (double)(~-(ulong)(dVar9 < 0.0) &
                               (~-(ulong)(dVar9 < 0.0) & 0x3fe0000000000000 |
                               (ulong)local_108 & -(ulong)(dVar9 < 0.0)) |
                              (ulong)((dVar14 * -0.5) / (dVar9 * 0.5 - dVar14)) &
                              -(ulong)(dVar9 < 0.0));
              local_108 = 0.1;
              if (local_48 < local_d8 && 0.1 <= dVar3) {
                local_108 = dVar3;
              }
              uStack_100 = 0;
              uVar12 = -(ulong)(delta <= local_98 / 0.1);
              delta = (double)(uVar12 & (ulong)delta | ~uVar12 & (ulong)(local_98 / 0.1)) *
                      local_108;
              par = par / local_108;
            }
            else if ((0.75 <= dVar15) || ((par == 0.0 && (!NAN(par))))) {
              delta = local_98 + local_98;
              par = par * 0.5;
            }
            dVar13 = local_d8;
            uVar17 = uStack_d0;
            dVar16 = local_c8;
            if (0.0001 <= dVar15) {
              lVar4 = *n;
              if (0 < lVar4) {
                lVar5 = 0;
                do {
                  dVar3 = wa2[lVar5];
                  x[lVar5] = dVar3;
                  wa2[lVar5] = dVar3 * diag[lVar5];
                  lVar5 = lVar5 + 1;
                } while (lVar4 != lVar5);
              }
              uStack_90 = 0;
              uStack_c0 = 0;
              lVar4 = *m;
              if (0 < lVar4) {
                lVar5 = 0;
                do {
                  fvec[lVar5] = wa4[lVar5];
                  lVar5 = lVar5 + 1;
                } while (lVar4 != lVar5);
              }
              local_d8 = dVar19;
              uStack_d0 = uVar18;
              local_c8 = dVar15;
              local_98 = dVar9;
              dVar16 = enorm_cvkit(n,wa2);
              local_e0 = local_e0 + 1;
              uVar17 = 0;
              dVar13 = local_b0;
              dVar15 = local_c8;
              dVar19 = local_d8;
              dVar9 = local_98;
            }
            uVar12 = -(ulong)(-dVar9 <= dVar9);
            dVar3 = (double)(~uVar12 & (ulong)-dVar9 | uVar12 & (ulong)dVar9);
            dVar9 = *local_a0;
            dVar14 = dVar15 * 0.5;
            if (dVar14 <= 1.0 && (dVar19 <= dVar9 && dVar3 <= dVar9)) {
              *info = 1;
            }
            if (delta <= *xtol * dVar16) {
              *info = 2;
            }
            if ((dVar14 <= 1.0 && (dVar19 <= dVar9 && dVar3 <= dVar9)) && *info == 2) {
              lVar4 = 3;
              goto LAB_0011b79a;
            }
            if (*info != 0) goto LAB_0011b79d;
            if (((local_58 >= dVar3 && local_58 >= dVar19) && 1.0 >= dVar14) || (*maxfev <= *nfev))
            {
              *info = 6 - (ulong)((local_58 < dVar3 || local_58 < dVar19) || 1.0 < dVar14);
              if ((local_58 < local_88) && (dVar16 * local_58 < delta)) goto LAB_0011b79d;
LAB_0011b78c:
              lVar4 = 8 - (ulong)(local_58 < local_88);
              goto LAB_0011b79a;
            }
            if ((local_88 <= local_58) || (delta <= local_58 * dVar16)) goto LAB_0011b78c;
            local_d8 = dVar13;
            uStack_d0 = uVar17;
            local_c8 = dVar16;
          } while (dVar15 < 0.0001);
        }
      }
    }
LAB_0011b7a6:
    *info = local_118;
  }
LAB_0011b7a9:
  local_118 = 0;
  if (0 < *nprint) {
    (*local_e8)((ulong)(uint)*n,x,(ulong)(uint)*m,fvec);
  }
  return 0;
}

Assistant:

int lmdif_cvkit(S_fp fcn, integer *m, integer *n, doublereal *x,
	doublereal *fvec, doublereal *ftol, doublereal *xtol, doublereal *
	gtol, integer *maxfev, doublereal *epsfcn, doublereal *diag, integer *
	mode, doublereal *factor, integer *nprint, integer *info, integer *
	nfev, doublereal *fjac, integer *ldfjac, integer *ipvt, doublereal *
	qtf, doublereal *wa1, doublereal *wa2, doublereal *wa3, doublereal *
	wa4, void *up)
{
    /* Initialized data */

    static doublereal one = 1.;
    static doublereal p1 = .1;
    static doublereal p5 = .5;
    static doublereal p25 = .25;
    static doublereal p75 = .75;
    static doublereal p0001 = 1e-4;
    static doublereal zero = 0.;

    /* System generated locals */
    integer fjac_dim1, fjac_offset, i__1, i__2;
    doublereal d__1, d__2, d__3;

    /* Builtin functions */
    double sqrt(doublereal);

    /* Local variables */
    integer iter;
    doublereal temp=0, temp1, temp2;
    integer i__, j, l, fret, iflag;
    doublereal delta;
    extern /* Subroutine */ int qrfac_cvkit(integer *, integer *, doublereal *,
	    integer *, logical *, integer *, integer *, doublereal *,
	    doublereal *, doublereal *), lmpar_cvkit(integer *, doublereal *,
	    integer *, integer *, doublereal *, doublereal *, doublereal *,
	    doublereal *, doublereal *, doublereal *, doublereal *,
	    doublereal *);
    doublereal ratio;
    extern doublereal enorm_cvkit(integer *, doublereal *);
    doublereal fnorm, gnorm;
    extern /* Subroutine */ int fdjac2_cvkit(S_fp, integer *, integer *,
	    doublereal *, doublereal *, doublereal *, integer *, integer *,
	    doublereal *, doublereal *, void *);
    doublereal pnorm, xnorm=0, fnorm1, actred, dirder, epsmch, prered;
    extern doublereal dpmpar_cvkit(integer *);
    doublereal par, sum;

/*<       integer m,n,maxfev,mode,nprint,info,nfev,ldfjac >*/
/*<       integer ipvt(n) >*/
/*<       double precision ftol,xtol,gtol,epsfcn,factor >*/
/*<    >*/
/*<       external fcn >*/
/*     ********** */

/*     subroutine lmdif */

/*     the purpose of lmdif is to minimize the sum of the squares of */
/*     m nonlinear functions in n variables by a modification of */
/*     the levenberg-marquardt algorithm. the user must provide a */
/*     subroutine which calculates the functions. the jacobian is */
/*     then calculated by a forward-difference approximation. */

/*     the subroutine statement is */

/*       subroutine mp_lmdif(fcn,m,n,x,fvec,ftol,xtol,gtol,maxfev,epsfcn, */
/*                        diag,mode,factor,nprint,info,nfev,fjac, */
/*                        ldfjac,ipvt,qtf,wa1,wa2,wa3,wa4) */

/*     where */

/*       fcn is the name of the user-supplied subroutine which */
/*         calculates the functions. fcn must be declared */
/*         in an external statement in the user calling */
/*         program, and should be written as follows. */

/*         subroutine fcn(m,n,x,fvec,iflag) */
/*         integer m,n,iflag */
/*         double precision x(n),fvec(m) */
/*         ---------- */
/*         calculate the functions at x and */
/*         return this vector in fvec. */
/*         ---------- */
/*         return */
/*         end */

/*         the value of iflag should not be changed by fcn unless */
/*         the user wants to terminate execution of lmdif. */
/*         in this case set iflag to a negative integer. */

/*       m is a positive integer input variable set to the number */
/*         of functions. */

/*       n is a positive integer input variable set to the number */
/*         of variables. n must not exceed m. */

/*       x is an array of length n. on input x must contain */
/*         an initial estimate of the solution vector. on output x */
/*         contains the final estimate of the solution vector. */

/*       fvec is an output array of length m which contains */
/*         the functions evaluated at the output x. */

/*       ftol is a nonnegative input variable. termination */
/*         occurs when both the actual and predicted relative */
/*         reductions in the sum of squares are at most ftol. */
/*         therefore, ftol measures the relative error desired */
/*         in the sum of squares. */

/*       xtol is a nonnegative input variable. termination */
/*         occurs when the relative error between two consecutive */
/*         iterates is at most xtol. therefore, xtol measures the */
/*         relative error desired in the approximate solution. */

/*       gtol is a nonnegative input variable. termination */
/*         occurs when the cosine of the angle between fvec and */
/*         any column of the jacobian is at most gtol in absolute */
/*         value. therefore, gtol measures the orthogonality */
/*         desired between the function vector and the columns */
/*         of the jacobian. */

/*       maxfev is a positive integer input variable. termination */
/*         occurs when the number of calls to fcn is at least */
/*         maxfev by the end of an iteration. */

/*       epsfcn is an input variable used in determining a suitable */
/*         step length for the forward-difference approximation. this */
/*         approximation assumes that the relative errors in the */
/*         functions are of the order of epsfcn. if epsfcn is less */
/*         than the machine precision, it is assumed that the relative */
/*         errors in the functions are of the order of the machine */
/*         precision. */

/*       diag is an array of length n. if mode = 1 (see */
/*         below), diag is internally set. if mode = 2, diag */
/*         must contain positive entries that serve as */
/*         multiplicative scale factors for the variables. */

/*       mode is an integer input variable. if mode = 1, the */
/*         variables will be scaled internally. if mode = 2, */
/*         the scaling is specified by the input diag. other */
/*         values of mode are equivalent to mode = 1. */

/*       factor is a positive input variable used in determining the */
/*         initial step bound. this bound is set to the product of */
/*         factor and the euclidean norm of diag*x if nonzero, or else */
/*         to factor itself. in most cases factor should lie in the */
/*         interval (.1,100.). 100. is a generally recommended value. */

/*       nprint is an integer input variable that enables controlled */
/*         printing of iterates if it is positive. in this case, */
/*         fcn is called with iflag = 0 at the beginning of the first */
/*         iteration and every nprint iterations thereafter and */
/*         immediately prior to return, with x and fvec available */
/*         for printing. if nprint is not positive, no special calls */
/*         of fcn with iflag = 0 are made. */

/*       info is an integer output variable. if the user has */
/*         terminated execution, info is set to the (negative) */
/*         value of iflag. see description of fcn. otherwise, */
/*         info is set as follows. */

/*         info = 0  improper input parameters. */

/*         info = 1  both actual and predicted relative reductions */
/*                   in the sum of squares are at most ftol. */

/*         info = 2  relative error between two consecutive iterates */
/*                   is at most xtol. */

/*         info = 3  conditions for info = 1 and info = 2 both hold. */

/*         info = 4  the cosine of the angle between fvec and any */
/*                   column of the jacobian is at most gtol in */
/*                   absolute value. */

/*         info = 5  number of calls to fcn has reached or */
/*                   exceeded maxfev. */

/*         info = 6  ftol is too small. no further reduction in */
/*                   the sum of squares is possible. */

/*         info = 7  xtol is too small. no further improvement in */
/*                   the approximate solution x is possible. */

/*         info = 8  gtol is too small. fvec is orthogonal to the */
/*                   columns of the jacobian to machine precision. */

/*       nfev is an integer output variable set to the number of */
/*         calls to fcn. */

/*       fjac is an output m by n array. the upper n by n submatrix */
/*         of fjac contains an upper triangular matrix r with */
/*         diagonal elements of nonincreasing magnitude such that */

/*                t     t           t */
/*               p *(jac *jac)*p = r *r, */

/*         where p is a permutation matrix and jac is the final */
/*         calculated jacobian. column j of p is column ipvt(j) */
/*         (see below) of the identity matrix. the lower trapezoidal */
/*         part of fjac contains information generated during */
/*         the computation of r. */

/*       ldfjac is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array fjac. */

/*       ipvt is an integer output array of length n. ipvt */
/*         defines a permutation matrix p such that jac*p = q*r, */
/*         where jac is the final calculated jacobian, q is */
/*         orthogonal (not stored), and r is upper triangular */
/*         with diagonal elements of nonincreasing magnitude. */
/*         column j of p is column ipvt(j) of the identity matrix. */

/*       qtf is an output array of length n which contains */
/*         the first n elements of the vector (q transpose)*fvec. */

/*       wa1, wa2, and wa3 are work arrays of length n. */

/*       wa4 is a work array of length m. */

/*     subprograms called */

/*       user-supplied ...... fcn */

/*       minpack-supplied ... dpmpar,enorm,fdjac2,lmpar,qrfac */

/*       fortran-supplied ... dabs,dmax1,dmin1,dsqrt,mod */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
/*<       integer i,iflag,iter,j,l >*/
/*<    >*/
/*<       double precision dpmpar,enorm >*/
/*<    >*/
    /* Parameter adjustments */
    --wa4;
    --fvec;
    --wa3;
    --wa2;
    --wa1;
    --qtf;
    --ipvt;
    --diag;
    --x;
    fjac_dim1 = *ldfjac;
    fjac_offset = 1 + fjac_dim1 * 1;
    fjac -= fjac_offset;

    /* Function Body */

/*     epsmch is the machine precision. */

/*<       epsmch = dpmpar(1) >*/
    epsmch = dpmpar_cvkit(&c__1);

/*<       info = 0 >*/
    *info = 0;
/*<       iflag = 0 >*/
    iflag = 0;
/*<       nfev = 0 >*/
    *nfev = 0;

/*     check the input parameters for errors. */

/*<    >*/
    if (*n <= 0 || *m < *n || *ldfjac < *m || *ftol < zero || *xtol < zero ||
	    *gtol < zero || *maxfev <= 0 || *factor <= zero) {
	goto L300;
    }
/*<       if (mode .ne. 2) go to 20 >*/
    if (*mode != 2) {
	goto L20;
    }
/*<       do 10 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          if (diag(j) .le. zero) go to 300 >*/
	if (diag[j] <= zero) {
	    goto L300;
	}
/*<    10    continue >*/
/* L10: */
    }
/*<    20 continue >*/
L20:

/*     evaluate the function at the starting point */
/*     and calculate its norm. */

/*<       iflag = 1 >*/
    iflag = 1;
/*<       call fcn(m,n,x,fvec,iflag) >*/
    fret=(*fcn)((int) *n, &x[1], (int) *m, &fvec[1], up);
    if (fret < 0)
      iflag=fret;
/*<       nfev = 1 >*/
    *nfev = 1;
/*<       if (iflag .lt. 0) go to 300 >*/
    if (iflag < 0) {
	goto L300;
    }
/*<       fnorm = enorm(m,fvec) >*/
    fnorm = enorm_cvkit(m, &fvec[1]);

/*     initialize levenberg-marquardt parameter and iteration counter. */

/*<       par = zero >*/
    par = zero;
/*<       iter = 1 >*/
    iter = 1;

/*     beginning of the outer loop. */

/*<    30 continue >*/
L30:

/*        calculate the jacobian matrix. */

/*<          iflag = 2 >*/
    iflag = 2;
/*<          call fdjac2(fcn,m,n,x,fvec,fjac,ldfjac,iflag,epsfcn,wa4) >*/
    fdjac2_cvkit((S_fp)fcn, m, n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &
	    iflag, epsfcn, &wa4[1], up);
/*<          nfev = nfev + n >*/
    *nfev += *n;
/*<          if (iflag .lt. 0) go to 300 >*/
    if (iflag < 0) {
	goto L300;
    }

/*        if requested, call fcn to enable printing of iterates. */

/*<          if (nprint .le. 0) go to 40 >*/
    if (*nprint <= 0) {
	goto L40;
    }
/*<          iflag = 0 >*/
    iflag = 0;
/*<          if (mod(iter-1,nprint) .eq. 0) call fcn(m,n,x,fvec,iflag) >*/
    if ((iter - 1) % *nprint == 0) {
	fret=(*fcn)((int) *n, &x[1], (int) *m, &fvec[1], up);
	if (fret < 0)
	  iflag=fret;
    }
/*<          if (iflag .lt. 0) go to 300 >*/
    if (iflag < 0) {
	goto L300;
    }
/*<    40    continue >*/
L40:

/*        compute the qr factorization of the jacobian. */

/*<          call qrfac(m,n,fjac,ldfjac,.true.,ipvt,n,wa1,wa2,wa3) >*/
    qrfac_cvkit(m, n, &fjac[fjac_offset], ldfjac, &c_true, &ipvt[1], n, &wa1[1], &
	    wa2[1], &wa3[1]);

/*        on the first iteration and if mode is 1, scale according */
/*        to the norms of the columns of the initial jacobian. */

/*<          if (iter .ne. 1) go to 80 >*/
    if (iter != 1) {
	goto L80;
    }
/*<          if (mode .eq. 2) go to 60 >*/
    if (*mode == 2) {
	goto L60;
    }
/*<          do 50 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             diag(j) = wa2(j) >*/
	diag[j] = wa2[j];
/*<             if (wa2(j) .eq. zero) diag(j) = one >*/
	if (wa2[j] == zero) {
	    diag[j] = one;
	}
/*<    50       continue >*/
/* L50: */
    }
/*<    60    continue >*/
L60:

/*        on the first iteration, calculate the norm of the scaled x */
/*        and initialize the step bound delta. */

/*<          do 70 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             wa3(j) = diag(j)*x(j) >*/
	wa3[j] = diag[j] * x[j];
/*<    70       continue >*/
/* L70: */
    }
/*<          xnorm = enorm(n,wa3) >*/
    xnorm = enorm_cvkit(n, &wa3[1]);
/*<          delta = factor*xnorm >*/
    delta = *factor * xnorm;
/*<          if (delta .eq. zero) delta = factor >*/
    if (delta == zero) {
	delta = *factor;
    }
/*<    80    continue >*/
L80:

/*        form (q transpose)*fvec and store the first n components in */
/*        qtf. */

/*<          do 90 i = 1, m >*/
    i__1 = *m;
    for (i__ = 1; i__ <= i__1; ++i__) {
/*<             wa4(i) = fvec(i) >*/
	wa4[i__] = fvec[i__];
/*<    90       continue >*/
/* L90: */
    }
/*<          do 130 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             if (fjac(j,j) .eq. zero) go to 120 >*/
	if (fjac[j + j * fjac_dim1] == zero) {
	    goto L120;
	}
/*<             sum = zero >*/
	sum = zero;
/*<             do 100 i = j, m >*/
	i__2 = *m;
	for (i__ = j; i__ <= i__2; ++i__) {
/*<                sum = sum + fjac(i,j)*wa4(i) >*/
	    sum += fjac[i__ + j * fjac_dim1] * wa4[i__];
/*<   100          continue >*/
/* L100: */
	}
/*<             temp = -sum/fjac(j,j) >*/
	temp = -sum / fjac[j + j * fjac_dim1];
/*<             do 110 i = j, m >*/
	i__2 = *m;
	for (i__ = j; i__ <= i__2; ++i__) {
/*<                wa4(i) = wa4(i) + fjac(i,j)*temp >*/
	    wa4[i__] += fjac[i__ + j * fjac_dim1] * temp;
/*<   110          continue >*/
/* L110: */
	}
/*<   120       continue >*/
L120:
/*<             fjac(j,j) = wa1(j) >*/
	fjac[j + j * fjac_dim1] = wa1[j];
/*<             qtf(j) = wa4(j) >*/
	qtf[j] = wa4[j];
/*<   130       continue >*/
/* L130: */
    }

/*        compute the norm of the scaled gradient. */

/*<          gnorm = zero >*/
    gnorm = zero;
/*<          if (fnorm .eq. zero) go to 170 >*/
    if (fnorm == zero) {
	goto L170;
    }
/*<          do 160 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             l = ipvt(j) >*/
	l = ipvt[j];
/*<             if (wa2(l) .eq. zero) go to 150 >*/
	if (wa2[l] == zero) {
	    goto L150;
	}
/*<             sum = zero >*/
	sum = zero;
/*<             do 140 i = 1, j >*/
	i__2 = j;
	for (i__ = 1; i__ <= i__2; ++i__) {
/*<                sum = sum + fjac(i,j)*(qtf(i)/fnorm) >*/
	    sum += fjac[i__ + j * fjac_dim1] * (qtf[i__] / fnorm);
/*<   140          continue >*/
/* L140: */
	}
/*<             gnorm = dmax1(gnorm,dabs(sum/wa2(l))) >*/
/* Computing MAX */
	d__2 = gnorm, d__3 = (d__1 = sum / wa2[l], abs(d__1));
	gnorm = max(d__2,d__3);
/*<   150       continue >*/
L150:
/*<   160       continue >*/
/* L160: */
	;
    }
/*<   170    continue >*/
L170:

/*        test for convergence of the gradient norm. */

/*<          if (gnorm .le. gtol) info = 4 >*/
    if (gnorm <= *gtol) {
	*info = 4;
    }
/*<          if (info .ne. 0) go to 300 >*/
    if (*info != 0) {
	goto L300;
    }

/*        rescale if necessary. */

/*<          if (mode .eq. 2) go to 190 >*/
    if (*mode == 2) {
	goto L190;
    }
/*<          do 180 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             diag(j) = dmax1(diag(j),wa2(j)) >*/
/* Computing MAX */
	d__1 = diag[j], d__2 = wa2[j];
	diag[j] = max(d__1,d__2);
/*<   180       continue >*/
/* L180: */
    }
/*<   190    continue >*/
L190:

/*        beginning of the inner loop. */

/*<   200    continue >*/
L200:

/*           determine the levenberg-marquardt parameter. */

/*<    >*/
    lmpar_cvkit(n, &fjac[fjac_offset], ldfjac, &ipvt[1], &diag[1], &qtf[1], &delta,
	     &par, &wa1[1], &wa2[1], &wa3[1], &wa4[1]);

/*           store the direction p and x + p. calculate the norm of p. */

/*<             do 210 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<                wa1(j) = -wa1(j) >*/
	wa1[j] = -wa1[j];
/*<                wa2(j) = x(j) + wa1(j) >*/
	wa2[j] = x[j] + wa1[j];
/*<                wa3(j) = diag(j)*wa1(j) >*/
	wa3[j] = diag[j] * wa1[j];
/*<   210          continue >*/
/* L210: */
    }
/*<             pnorm = enorm(n,wa3) >*/
    pnorm = enorm_cvkit(n, &wa3[1]);

/*           on the first iteration, adjust the initial step bound. */

/*<             if (iter .eq. 1) delta = dmin1(delta,pnorm) >*/
    if (iter == 1) {
	delta = min(delta,pnorm);
    }

/*           evaluate the function at x + p and calculate its norm. */

/*<             iflag = 1 >*/
    iflag = 1;
/*<             call fcn(m,n,wa2,wa4,iflag) >*/
    fret=(*fcn)((int) *n, &wa2[1], (int) *m, &wa4[1], up);
    if (fret < 0)
      fret=iflag;
/*<             nfev = nfev + 1 >*/
    ++(*nfev);
/*<             if (iflag .lt. 0) go to 300 >*/
    if (iflag < 0) {
	goto L300;
    }
/*<             fnorm1 = enorm(m,wa4) >*/
    fnorm1 = enorm_cvkit(m, &wa4[1]);

/*           compute the scaled actual reduction. */

/*<             actred = -one >*/
    actred = -one;
/*<             if (p1*fnorm1 .lt. fnorm) actred = one - (fnorm1/fnorm)**2 >*/
    if (p1 * fnorm1 < fnorm) {
/* Computing 2nd power */
	d__1 = fnorm1 / fnorm;
	actred = one - d__1 * d__1;
    }

/*           compute the scaled predicted reduction and */
/*           the scaled directional derivative. */

/*<             do 230 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<                wa3(j) = zero >*/
	wa3[j] = zero;
/*<                l = ipvt(j) >*/
	l = ipvt[j];
/*<                temp = wa1(l) >*/
	temp = wa1[l];
/*<                do 220 i = 1, j >*/
	i__2 = j;
	for (i__ = 1; i__ <= i__2; ++i__) {
/*<                   wa3(i) = wa3(i) + fjac(i,j)*temp >*/
	    wa3[i__] += fjac[i__ + j * fjac_dim1] * temp;
/*<   220             continue >*/
/* L220: */
	}
/*<   230          continue >*/
/* L230: */
    }
/*<             temp1 = enorm(n,wa3)/fnorm >*/
    temp1 = enorm_cvkit(n, &wa3[1]) / fnorm;
/*<             temp2 = (dsqrt(par)*pnorm)/fnorm >*/
    temp2 = sqrt(par) * pnorm / fnorm;
/*<             prered = temp1**2 + temp2**2/p5 >*/
/* Computing 2nd power */
    d__1 = temp1;
/* Computing 2nd power */
    d__2 = temp2;
    prered = d__1 * d__1 + d__2 * d__2 / p5;
/*<             dirder = -(temp1**2 + temp2**2) >*/
/* Computing 2nd power */
    d__1 = temp1;
/* Computing 2nd power */
    d__2 = temp2;
    dirder = -(d__1 * d__1 + d__2 * d__2);

/*           compute the ratio of the actual to the predicted */
/*           reduction. */

/*<             ratio = zero >*/
    ratio = zero;
/*<             if (prered .ne. zero) ratio = actred/prered >*/
    if (prered != zero) {
	ratio = actred / prered;
    }

/*           update the step bound. */

/*<             if (ratio .gt. p25) go to 240 >*/
    if (ratio > p25) {
	goto L240;
    }
/*<                if (actred .ge. zero) temp = p5 >*/
    if (actred >= zero) {
	temp = p5;
    }
/*<    >*/
    if (actred < zero) {
	temp = p5 * dirder / (dirder + p5 * actred);
    }
/*<                if (p1*fnorm1 .ge. fnorm .or. temp .lt. p1) temp = p1 >*/
    if (p1 * fnorm1 >= fnorm || temp < p1) {
	temp = p1;
    }
/*<                delta = temp*dmin1(delta,pnorm/p1) >*/
/* Computing MIN */
    d__1 = delta, d__2 = pnorm / p1;
    delta = temp * min(d__1,d__2);
/*<                par = par/temp >*/
    par /= temp;
/*<                go to 260 >*/
    goto L260;
/*<   240       continue >*/
L240:
/*<                if (par .ne. zero .and. ratio .lt. p75) go to 250 >*/
    if (par != zero && ratio < p75) {
	goto L250;
    }
/*<                delta = pnorm/p5 >*/
    delta = pnorm / p5;
/*<                par = p5*par >*/
    par = p5 * par;
/*<   250          continue >*/
L250:
/*<   260       continue >*/
L260:

/*           test for successful iteration. */

/*<             if (ratio .lt. p0001) go to 290 >*/
    if (ratio < p0001) {
	goto L290;
    }

/*           successful iteration. update x, fvec, and their norms. */

/*<             do 270 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<                x(j) = wa2(j) >*/
	x[j] = wa2[j];
/*<                wa2(j) = diag(j)*x(j) >*/
	wa2[j] = diag[j] * x[j];
/*<   270          continue >*/
/* L270: */
    }
/*<             do 280 i = 1, m >*/
    i__1 = *m;
    for (i__ = 1; i__ <= i__1; ++i__) {
/*<                fvec(i) = wa4(i) >*/
	fvec[i__] = wa4[i__];
/*<   280          continue >*/
/* L280: */
    }
/*<             xnorm = enorm(n,wa2) >*/
    xnorm = enorm_cvkit(n, &wa2[1]);
/*<             fnorm = fnorm1 >*/
    fnorm = fnorm1;
/*<             iter = iter + 1 >*/
    ++iter;
/*<   290       continue >*/
L290:

/*           tests for convergence. */

/*<    >*/
    if (abs(actred) <= *ftol && prered <= *ftol && p5 * ratio <= one) {
	*info = 1;
    }
/*<             if (delta .le. xtol*xnorm) info = 2 >*/
    if (delta <= *xtol * xnorm) {
	*info = 2;
    }
/*<    >*/
    if (abs(actred) <= *ftol && prered <= *ftol && p5 * ratio <= one && *info
	    == 2) {
	*info = 3;
    }
/*<             if (info .ne. 0) go to 300 >*/
    if (*info != 0) {
	goto L300;
    }

/*           tests for termination and stringent tolerances. */

/*<             if (nfev .ge. maxfev) info = 5 >*/
    if (*nfev >= *maxfev) {
	*info = 5;
    }
/*<    >*/
    if (abs(actred) <= epsmch && prered <= epsmch && p5 * ratio <= one) {
	*info = 6;
    }
/*<             if (delta .le. epsmch*xnorm) info = 7 >*/
    if (delta <= epsmch * xnorm) {
	*info = 7;
    }
/*<             if (gnorm .le. epsmch) info = 8 >*/
    if (gnorm <= epsmch) {
	*info = 8;
    }
/*<             if (info .ne. 0) go to 300 >*/
    if (*info != 0) {
	goto L300;
    }

/*           end of the inner loop. repeat if iteration unsuccessful. */

/*<             if (ratio .lt. p0001) go to 200 >*/
    if (ratio < p0001) {
	goto L200;
    }

/*        end of the outer loop. */

/*<          go to 30 >*/
    goto L30;
/*<   300 continue >*/
L300:

/*     termination, either normal or user imposed. */

/*<       if (iflag .lt. 0) info = iflag >*/
    if (iflag < 0) {
	*info = iflag;
    }
/*<       iflag = 0 >*/
    iflag = 0;
/*<       if (nprint .gt. 0) call fcn(m,n,x,fvec,iflag) >*/
    if (*nprint > 0) {
	fret=(*fcn)((int) *n, &x[1], (int) *m, &fvec[1]);
	if (fret < 0)
	  iflag=fret;
    }
/*<       return >*/
    return 0;

/*     last card of subroutine lmdif. */

/*<       end >*/
}